

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::linkHovered(QLabelPrivate *this,QString *anchor)

{
  bool bVar1;
  QLabel *pQVar2;
  QWidget *in_RSI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  QString *in_stack_ffffffffffffffb8;
  QLabel *in_stack_ffffffffffffffc0;
  QCursor local_18;
  QCursor local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = QString::isEmpty((QString *)0x5b349e);
  if (bVar1) {
    if ((*(ushort *)&in_RDI->field_0x340 >> 6 & 1) == 0) {
      QWidget::unsetCursor((QWidget *)in_RDI);
    }
    else {
      QWidget::setCursor(in_RSI,(QCursor *)pQVar2);
    }
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xff7f;
  }
  else if ((*(ushort *)&in_RDI->field_0x340 >> 7 & 1) == 0) {
    bVar1 = QWidget::testAttribute
                      ((QWidget *)in_RDI,(WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20)
                      );
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xffbf | (ushort)bVar1 << 6;
    in_stack_ffffffffffffffc0 = pQVar2;
    if ((*(ushort *)&in_RDI->field_0x340 >> 6 & 1) != 0) {
      QWidget::cursor(in_RSI);
      QCursor::operator=((QCursor *)pQVar2,(QCursor *)in_RDI);
      QCursor::~QCursor(&local_10);
      in_stack_ffffffffffffffc0 = pQVar2;
    }
    pQVar2 = in_stack_ffffffffffffffc0;
    QCursor::QCursor(&local_18,PointingHandCursor);
    QWidget::setCursor(in_RSI,(QCursor *)pQVar2);
    QCursor::~QCursor(&local_18);
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xff7f | 0x80;
  }
  QLabel::linkHovered(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::linkHovered(const QString &anchor)
{
    Q_Q(QLabel);
#ifndef QT_NO_CURSOR
    if (anchor.isEmpty()) { // restore cursor
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
        onAnchor = false;
    } else if (!onAnchor) {
        validCursor = q->testAttribute(Qt::WA_SetCursor);
        if (validCursor) {
            cursor = q->cursor();
        }
        q->setCursor(Qt::PointingHandCursor);
        onAnchor = true;
    }
#endif
    emit q->linkHovered(anchor);
}